

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

IRType crec_ct2irt(CTState *cts,CType *ct)

{
  uint uVar1;
  CType *pCStack_50;
  uint32_t b;
  CType *ct_local;
  CTState *cts_local;
  
  pCStack_50 = ct;
  if (ct->info >> 0x1c == 5) {
    pCStack_50 = cts->tab + (ct->info & 0xffff);
  }
  if (pCStack_50->info >> 0x1c == 0) {
    if ((pCStack_50->info & 0x4000000) == 0) {
      uVar1 = 0x1f;
      if (pCStack_50->size != 0) {
        for (; pCStack_50->size >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (uVar1 < 4) {
        return uVar1 * 2 + 0xf + (uint)((pCStack_50->info & 0x800000) != 0);
      }
    }
    else {
      if (pCStack_50->size == 8) {
        return IRT_NUM;
      }
      if (pCStack_50->size == 4) {
        return IRT_FLOAT;
      }
    }
  }
  else {
    if (pCStack_50->info >> 0x1c == 2) {
      if (pCStack_50->size != 8) {
        return IRT_P32;
      }
      return IRT_P64;
    }
    if ((pCStack_50->info & 0xf4000000) == 0x34000000) {
      if (pCStack_50->size == 0x10) {
        return IRT_NUM;
      }
      if (pCStack_50->size == 8) {
        return IRT_FLOAT;
      }
    }
  }
  return IRT_CDATA;
}

Assistant:

static IRType crec_ct2irt(CTState *cts, CType *ct)
{
  if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
  if (LJ_LIKELY(ctype_isnum(ct->info))) {
    if ((ct->info & CTF_FP)) {
      if (ct->size == sizeof(double))
	return IRT_NUM;
      else if (ct->size == sizeof(float))
	return IRT_FLOAT;
    } else {
      uint32_t b = lj_fls(ct->size);
      if (b <= 3)
	return IRT_I8 + 2*b + ((ct->info & CTF_UNSIGNED) ? 1 : 0);
    }
  } else if (ctype_isptr(ct->info)) {
    return (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
  } else if (ctype_iscomplex(ct->info)) {
    if (ct->size == 2*sizeof(double))
      return IRT_NUM;
    else if (ct->size == 2*sizeof(float))
      return IRT_FLOAT;
  }
  return IRT_CDATA;
}